

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  size_t *psVar1;
  size_t __n;
  LRUHandle *pLVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  LRUHandle *pLVar8;
  LRUHandle **ppLVar9;
  LRUHandle *pLVar10;
  Mutex *__mutex;
  LRUCache *this_00;
  
  uVar4 = Hash(key->data_,key->size_,0);
  uVar5 = uVar4 >> 0x1c;
  __mutex = &this->shard_[uVar5].mutex_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  this_00 = this->shard_ + uVar5;
  __n = key->size_;
  pLVar8 = (LRUHandle *)malloc(__n + 0x47);
  pLVar8->value = value;
  pLVar8->deleter = deleter;
  pLVar8->charge = charge;
  pLVar8->key_length = __n;
  pLVar8->hash = uVar4;
  pLVar8->in_cache = false;
  pLVar8->refs = 1;
  memcpy(pLVar8->key_data,key->data_,__n);
  if (this_00->capacity_ == 0) {
    pLVar8->next = (LRUHandle *)0x0;
  }
  else {
    pLVar8->refs = 2;
    pLVar8->in_cache = true;
    pLVar10 = &this->shard_[uVar5].in_use_;
    pLVar8->next = pLVar10;
    pLVar2 = this->shard_[uVar5].in_use_.prev;
    pLVar8->prev = pLVar2;
    pLVar2->next = pLVar8;
    this->shard_[uVar5].in_use_.prev = pLVar8;
    psVar1 = &this->shard_[uVar5].usage_;
    *psVar1 = *psVar1 + charge;
    if (pLVar10 == pLVar8) goto LAB_0011d676;
    ppLVar9 = HandleTable::FindPointer
                        ((HandleTable *)(ulong)this->shard_[uVar5].table_.length_,
                         (Slice *)this->shard_[uVar5].table_.list_,(uint32_t)pLVar8->key_data);
    pLVar10 = *ppLVar9;
    if (pLVar10 == (LRUHandle *)0x0) {
      pLVar8->next_hash = (LRUHandle *)0x0;
      *ppLVar9 = pLVar8;
      uVar7 = this->shard_[uVar5].table_.elems_ + 1;
      this->shard_[uVar5].table_.elems_ = uVar7;
      if (this->shard_[uVar5].table_.length_ < uVar7) {
        HandleTable::Resize(&this->shard_[uVar5].table_);
      }
    }
    else {
      pLVar8->next_hash = pLVar10->next_hash;
      *ppLVar9 = pLVar8;
    }
    LRUCache::FinishErase(this_00,pLVar10);
  }
  while( true ) {
    if ((this->shard_[uVar5].usage_ <= this_00->capacity_) ||
       (pLVar10 = this->shard_[uVar5].lru_.next, pLVar10 == &this->shard_[uVar5].lru_)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (Handle *)pLVar8;
    }
    if (pLVar10->refs != 1) {
      __assert_fail("old->refs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                    ,0x127,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
    if (pLVar10->next == pLVar10) break;
    pLVar10 = HandleTable::Remove(&this->shard_[uVar5].table_,(Slice *)pLVar10->key_data,
                                  (uint32_t)pLVar10->key_length);
    bVar3 = LRUCache::FinishErase(this_00,pLVar10);
    if (!bVar3) {
      __assert_fail("erased",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                    ,0x12a,
                    "Cache::Handle *leveldb::(anonymous namespace)::LRUCache::Insert(const Slice &, uint32_t, void *, size_t, void (*)(const Slice &, void *))"
                   );
    }
  }
LAB_0011d676:
  __assert_fail("next != this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/cache.cc"
                ,0x3a,"Slice leveldb::(anonymous namespace)::LRUHandle::key() const");
}

Assistant:

Handle* Insert(const Slice& key, void* value, size_t charge,
                 void (*deleter)(const Slice& key, void* value)) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
  }